

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<unsigned_long_long,QOpenGL2GradientCache::CacheInfo>::
emplace<QOpenGL2GradientCache::CacheInfo_const&>
          (QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this,
          unsigned_long_long *key,CacheInfo *args)

{
  long lVar1;
  bool bVar2;
  CacheInfo *in_RDX;
  QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *in_RSI;
  CacheInfo *in_RDI;
  long in_FS_OFFSET;
  QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> copy;
  CacheInfo *in_stack_ffffffffffffff78;
  QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *in_stack_ffffffffffffff80;
  CacheInfo *key_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = in_RDI;
  bVar2 = QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::isDetached
                    (in_stack_ffffffffffffff80);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>::
            shouldGrow(in_RSI->d);
    if (bVar2) {
      QOpenGL2GradientCache::CacheInfo::CacheInfo(in_RDX,in_stack_ffffffffffffff78);
      QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
      emplace_helper<QOpenGL2GradientCache::CacheInfo>(in_RSI,(unsigned_long_long *)key_00,in_RDI);
      QOpenGL2GradientCache::CacheInfo::~CacheInfo((CacheInfo *)0x159a09);
    }
    else {
      emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>
                (in_RSI,(unsigned_long_long *)key_00,in_RDI);
    }
  }
  else {
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::QMultiHash
              (in_stack_ffffffffffffff80,
               (QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)
               in_stack_ffffffffffffff78);
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::detach
              (in_stack_ffffffffffffff80);
    emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>
              (in_RSI,(unsigned_long_long *)key_00,in_RDI);
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::~QMultiHash
              (in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator *)key_00;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }